

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::
do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,big_decimal_fp *f,format_specs *specs,sign s,int exp_upper,
          locale_ref loc)

{
  locale_ref lVar1;
  bool bVar2;
  presentation_type pVar3;
  make_unsigned_t<int> mVar4;
  int iVar5;
  basic_appender<char> bVar6;
  bool local_2a9;
  int local_294;
  undefined1 local_279;
  int local_278;
  char local_271;
  anon_class_56_7_88befd79 local_270;
  void *local_238;
  bool local_22d;
  int local_22c;
  undefined1 auStack_228 [3];
  bool pointy;
  int num_zeros;
  char **local_220;
  int *local_218;
  int *local_210;
  char *local_208;
  digit_grouping<char> *local_200;
  int *local_1f8;
  char *local_1f0;
  void *local_1e8;
  locale_ref local_1e0;
  undefined1 local_1d8 [8];
  digit_grouping<char> grouping_1;
  undefined1 auStack_190 [4];
  int num_zeros_3;
  char **local_188;
  int *local_180;
  big_decimal_fp *local_178;
  digit_grouping<char> *local_170;
  format_specs *local_168;
  char *local_160;
  int *local_158;
  char *local_150;
  void *local_148;
  locale_ref local_130;
  undefined1 local_128 [8];
  digit_grouping<char> grouping;
  int num_zeros_2;
  int exp;
  undefined1 local_b8 [8];
  anon_class_40_8_fd1bf2f9 write;
  int local_88;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_24_3_3ccdf9fd use_exp_format;
  int output_exp;
  char local_51;
  size_t sStack_50;
  char decimal_point;
  size_t size;
  char zero;
  char *pcStack_40;
  int significand_size;
  char *significand;
  int exp_upper_local;
  sign s_local;
  format_specs *specs_local;
  big_decimal_fp *f_local;
  locale_ref loc_local;
  basic_appender<char> out_local;
  
  pcStack_40 = f->significand;
  significand._0_4_ = exp_upper;
  significand._4_4_ = s;
  _exp_upper_local = specs;
  specs_local = (format_specs *)f;
  f_local = (big_decimal_fp *)loc.locale_;
  loc_local.locale_ = out.container;
  size._4_4_ = get_significand_size(f);
  size._3_1_ = 0x30;
  mVar4 = to_unsigned<int>(size._4_4_);
  sStack_50 = (size_t)(mVar4 + (significand._4_4_ != none));
  bVar2 = basic_specs::localized(&_exp_upper_local->super_basic_specs);
  if (bVar2) {
    stack0xffffffffffffffa0 = f_local;
    local_271 = decimal_point<char>((locale_ref)f_local);
  }
  else {
    local_271 = '.';
  }
  local_51 = local_271;
  use_exp_format.specs.width = specs_local->precision + size._4_4_ + -1;
  _abs_output_exp = _exp_upper_local->super_basic_specs;
  use_exp_format.specs.super_basic_specs = *(basic_specs *)&_exp_upper_local->width;
  use_exp_format.specs.precision = (int)significand;
  use_exp_format.output_exp = use_exp_format.specs.width;
  bVar2 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::big_decimal_fp,_fmt::v11::detail::digit_grouping<char>_>
          ::anon_class_24_3_3ccdf9fd::operator()((anon_class_24_3_3ccdf9fd *)&abs_output_exp);
  if (bVar2) {
    exp_digits = 0;
    bVar2 = basic_specs::alt(&_exp_upper_local->super_basic_specs);
    if (bVar2) {
      exp_digits = _exp_upper_local->precision - size._4_4_;
      if (exp_digits < 0) {
        exp_digits = 0;
      }
      mVar4 = to_unsigned<int>(exp_digits);
      sStack_50 = mVar4 + sStack_50;
    }
    else if (size._4_4_ == 1) {
      local_51 = '\0';
    }
    if (use_exp_format.output_exp < 0) {
      local_278 = -use_exp_format.output_exp;
    }
    else {
      local_278 = use_exp_format.output_exp;
    }
    local_88 = 2;
    if ((99 < local_278) && (local_88 = 3, 999 < local_278)) {
      local_88 = 4;
    }
    mVar4 = to_unsigned<int>((local_51 != '\0') + 2 + local_88);
    sStack_50 = mVar4 + sStack_50;
    bVar2 = basic_specs::upper(&_exp_upper_local->super_basic_specs);
    lVar1 = loc_local;
    local_279 = 0x45;
    if (!bVar2) {
      local_279 = 0x65;
    }
    write._39_1_ = local_279;
    local_b8._0_4_ = significand._4_4_;
    write._0_8_ = pcStack_40;
    write.significand._0_4_ = size._4_4_;
    write.significand._4_1_ = local_51;
    write.significand_size = exp_digits;
    write.decimal_point = '0';
    write._21_1_ = local_279;
    write.num_zeros = use_exp_format.output_exp;
    if (_exp_upper_local->width < 1) {
      bVar6 = reserve<char>((basic_appender<char>)loc_local.locale_,sStack_50);
      bVar6 = do_write_float<char,_fmt::v11::basic_appender<char>,_fmt::v11::detail::big_decimal_fp,_fmt::v11::detail::digit_grouping<char>_>
              ::anon_class_40_8_fd1bf2f9::operator()
                        ((anon_class_40_8_fd1bf2f9 *)local_b8,bVar6.container);
      out_local = base_iterator<fmt::v11::basic_appender<char>>
                            ((basic_appender<char>)lVar1.locale_,bVar6);
    }
    else {
      out_local = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_1_&>
                            ((basic_appender<char>)loc_local.locale_,_exp_upper_local,sStack_50,
                             (anon_class_40_8_fd1bf2f9 *)local_b8);
    }
  }
  else {
    grouping.thousands_sep_.field_2._12_4_ = specs_local->precision + size._4_4_;
    if (specs_local->precision < 0) {
      if ((int)grouping.thousands_sep_.field_2._12_4_ < 1) {
        local_22c = -grouping.thousands_sep_.field_2._12_4_;
        if (((size._4_4_ == 0) && (-1 < _exp_upper_local->precision)) &&
           (_exp_upper_local->precision < local_22c)) {
          local_22c = _exp_upper_local->precision;
        }
        local_2a9 = true;
        if ((local_22c == 0) && (local_2a9 = true, size._4_4_ == 0)) {
          local_2a9 = basic_specs::alt(&_exp_upper_local->super_basic_specs);
        }
        local_22d = local_2a9;
        mVar4 = to_unsigned<int>(local_22c);
        sStack_50 = ((local_2a9 != false) + 1 + mVar4) + sStack_50;
        local_238 = loc_local.locale_;
        local_270.s = (sign *)((long)&significand + 4);
        local_270.pointy = &local_22d;
        local_270.decimal_point = &local_51;
        local_270.num_zeros = &local_22c;
        local_270.zero = (char *)((long)&size + 3);
        local_270.significand = &stack0xffffffffffffffc0;
        local_270.significand_size = (int *)((long)&size + 4);
        out_local = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_4_>
                              ((basic_appender<char>)loc_local.locale_,_exp_upper_local,sStack_50,
                               &local_270);
      }
      else {
        bVar2 = basic_specs::alt(&_exp_upper_local->super_basic_specs);
        if (bVar2) {
          local_294 = _exp_upper_local->precision - size._4_4_;
        }
        else {
          local_294 = 0;
        }
        grouping_1.thousands_sep_.field_2._12_4_ = local_294;
        iVar5 = max_of<int>(local_294,0);
        sStack_50 = sStack_50 + (iVar5 + 1);
        local_1e0.locale_ = f_local;
        bVar2 = basic_specs::localized(&_exp_upper_local->super_basic_specs);
        digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                  ((digit_grouping<char> *)local_1d8,local_1e0,bVar2);
        iVar5 = digit_grouping<char>::count_separators
                          ((digit_grouping<char> *)local_1d8,grouping.thousands_sep_.field_2._12_4_)
        ;
        mVar4 = to_unsigned<int>(iVar5);
        sStack_50 = sStack_50 + mVar4;
        local_1e8 = loc_local.locale_;
        _auStack_228 = (sign *)((long)&significand + 4);
        local_220 = &stack0xffffffffffffffc0;
        local_218 = (int *)((long)&size + 4);
        local_210 = (int *)((long)&grouping.thousands_sep_.field_2 + 0xc);
        local_208 = &local_51;
        local_200 = (digit_grouping<char> *)local_1d8;
        local_1f8 = (int *)((long)&grouping_1.thousands_sep_.field_2 + 0xc);
        local_1f0 = (char *)((long)&size + 3);
        out_local = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_3_>
                              ((basic_appender<char>)loc_local.locale_,_exp_upper_local,sStack_50,
                               (anon_class_64_8_085c650e *)auStack_228);
        digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_1d8);
      }
    }
    else {
      mVar4 = to_unsigned<int>(specs_local->precision);
      sStack_50 = mVar4 + sStack_50;
      grouping.thousands_sep_.field_2._8_4_ =
           _exp_upper_local->precision - grouping.thousands_sep_.field_2._12_4_;
      abort_fuzzing_if(5000 < (int)grouping.thousands_sep_.field_2._8_4_);
      bVar2 = basic_specs::alt(&_exp_upper_local->super_basic_specs);
      if (bVar2) {
        sStack_50 = sStack_50 + 1;
        if (((int)grouping.thousands_sep_.field_2._8_4_ < 1) &&
           (pVar3 = basic_specs::type(&_exp_upper_local->super_basic_specs), pVar3 != fixed)) {
          grouping.thousands_sep_.field_2._8_4_ = 0;
        }
        if (0 < (int)grouping.thousands_sep_.field_2._8_4_) {
          mVar4 = to_unsigned<int>(grouping.thousands_sep_.field_2._8_4_);
          sStack_50 = mVar4 + sStack_50;
        }
      }
      local_130.locale_ = f_local;
      bVar2 = basic_specs::localized(&_exp_upper_local->super_basic_specs);
      digit_grouping<char>::digit_grouping<fmt::v11::detail::locale_ref,_0>
                ((digit_grouping<char> *)local_128,local_130,bVar2);
      iVar5 = digit_grouping<char>::count_separators
                        ((digit_grouping<char> *)local_128,grouping.thousands_sep_.field_2._12_4_);
      mVar4 = to_unsigned<int>(iVar5);
      sStack_50 = sStack_50 + mVar4;
      local_148 = loc_local.locale_;
      _auStack_190 = (sign *)((long)&significand + 4);
      local_188 = &stack0xffffffffffffffc0;
      local_180 = (int *)((long)&size + 4);
      local_178 = (big_decimal_fp *)specs_local;
      local_170 = (digit_grouping<char> *)local_128;
      local_168 = _exp_upper_local;
      local_160 = &local_51;
      local_158 = (int *)((long)&grouping.thousands_sep_.field_2 + 8);
      local_150 = (char *)((long)&size + 3);
      out_local = write_padded<char,(fmt::v11::align)2,fmt::v11::basic_appender<char>,fmt::v11::detail::do_write_float<char,fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp,fmt::v11::detail::digit_grouping<char>>(fmt::v11::basic_appender<char>,fmt::v11::detail::big_decimal_fp_const&,fmt::v11::format_specs_const&,fmt::v11::sign,int,fmt::v11::detail::locale_ref)::_lambda(fmt::v11::basic_appender<char>)_2_>
                            ((basic_appender<char>)loc_local.locale_,_exp_upper_local,sStack_50,
                             (anon_class_72_9_eb40e20e *)auStack_190);
      digit_grouping<char>::~digit_grouping((digit_grouping<char> *)local_128);
    }
  }
  return (basic_appender<char>)out_local.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs& specs, sign s,
                                    int exp_upper, locale_ref loc) -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  size_t size = to_unsigned(significand_size) + (s != sign::none ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point = specs.localized() ? detail::decimal_point<Char>(loc)
                                         : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (specs.type() == presentation_type::exp) return true;
    if (specs.type() == presentation_type::fixed) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4;
    return output_exp < exp_lower ||
           output_exp >= (specs.precision > 0 ? specs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (specs.alt()) {
      num_zeros = specs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = specs.upper() ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0
               ? write_padded<Char, align::right>(out, specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = specs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (specs.alt()) {
      ++size;
      if (num_zeros <= 0 && specs.type() != presentation_type::fixed)
        num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!specs.alt()) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = specs.alt() ? specs.precision - significand_size : 0;
    size += 1 + static_cast<unsigned>(max_of(num_zeros, 0));
    auto grouping = Grouping(loc, specs.localized());
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
      if (s != sign::none) *it++ = detail::getsign<Char>(s);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && specs.precision >= 0 &&
      specs.precision < num_zeros) {
    num_zeros = specs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || specs.alt();
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<Char, align::right>(out, specs, size, [&](iterator it) {
    if (s != sign::none) *it++ = detail::getsign<Char>(s);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}